

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVersion.cpp
# Opt level: O2

void __thiscall
utVersion_aiGetVersionRevisionTest_Test::TestBody(utVersion_aiGetVersionRevisionTest_Test *this)

{
  char *message;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_20.ptr_._0_4_ = aiGetVersionRevision();
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"aiGetVersionRevision()","0U",(uint *)&local_20,(uint *)&local_28
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVersion.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F( utVersion, aiGetVersionRevisionTest ) {
    EXPECT_NE( aiGetVersionRevision(), 0U );
}